

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O1

MATRIX mat_backsubs1(MATRIX A,MATRIX B,MATRIX X,MATRIX P,int xcol)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  MATRIX ppdVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  
  iVar1 = *(int *)((long)A + -4);
  uVar4 = (ulong)iVar1;
  if (0 < (long)uVar4) {
    uVar6 = uVar4;
    ppdVar8 = P;
    uVar7 = 0;
    do {
      uVar9 = uVar7 + 1;
      if (uVar9 < uVar4) {
        pdVar2 = P[uVar7];
        uVar11 = 1;
        do {
          *B[(int)*ppdVar8[uVar11]] =
               *B[(int)*ppdVar8[uVar11]] - A[(int)*ppdVar8[uVar11]][uVar7] * *B[(int)*pdVar2];
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
      }
      ppdVar8 = ppdVar8 + 1;
      uVar6 = uVar6 - 1;
      uVar7 = uVar9;
    } while (uVar9 != uVar4);
  }
  X[uVar4 - 1][xcol] = *B[(int)*P[uVar4 - 1]] / A[(int)*P[uVar4 - 1]][uVar4 - 1];
  if (1 < iVar1) {
    uVar7 = (ulong)(iVar1 - 1);
    lVar5 = uVar7 * 8;
    ppdVar8 = X + uVar7;
    uVar6 = (ulong)(iVar1 - 2);
    do {
      dVar12 = 0.0;
      if ((long)uVar6 < (long)(uVar4 - 1)) {
        lVar10 = 0;
        do {
          dVar12 = dVar12 + *(double *)((long)A[(int)*P[uVar6]] + lVar10 * 8 + lVar5) *
                            ppdVar8[lVar10][xcol];
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 + (int)uVar7 < iVar1);
      }
      X[uVar6][xcol] = (*B[(int)*P[uVar6]] - dVar12) / A[(int)*P[uVar6]][uVar6];
      uVar7 = uVar7 - 1;
      ppdVar8 = ppdVar8 + -1;
      lVar5 = lVar5 + -8;
      bVar3 = 0 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar3);
  }
  return X;
}

Assistant:

MATRIX mat_backsubs1( MATRIX A, MATRIX B, MATRIX X, MATRIX P, int xcol )
{
	int	i, j, k, n;
	double	sum;

	n = MatCol(A);

	for (k=0; k<n; k++)
		{
		for (i=k+1; i<n; i++)
			B[(int)P[i][0]][0] -= A[(int)P[i][0]][k] * B[(int)P[k][0]][0];
		}

	X[n-1][xcol] = B[(int)P[n-1][0]][0] / A[(int)P[n-1][0]][n-1];
	for (k=n-2; k>=0; k--)
		{
		sum = 0.0;
		for (j=k+1; j<n; j++)
			{
			sum += A[(int)P[k][0]][j] * X[j][xcol];
			}
		X[k][xcol] = (B[(int)P[k][0]][0] - sum) / A[(int)P[k][0]][k];
		}

	return (X);
}